

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selu_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::SELU_x86_avx::forward_inplace(SELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 auVar6 [32];
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  
  iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar12 = 0;
  uVar7 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar7 = uVar12;
  }
  auVar34 = ZEXT3264(CONCAT428(0x3f800000,
                               CONCAT424(0x3f800000,
                                         CONCAT420(0x3f800000,
                                                   CONCAT416(0x3f800000,
                                                             CONCAT412(0x3f800000,
                                                                       CONCAT48(0x3f800000,
                                                                                0x3f8000003f800000))
                                                            )))));
  for (; uVar12 != uVar7; uVar12 = uVar12 + 1) {
    pvVar3 = bottom_top_blob->data;
    sVar4 = bottom_top_blob->elemsize;
    sVar5 = bottom_top_blob->cstep;
    pauVar9 = (undefined1 (*) [32])(sVar5 * uVar12 * sVar4 + (long)pvVar3);
    fVar1 = (this->super_SELU).alpha;
    fVar2 = (this->super_SELU).lambda;
    lVar13 = 0;
    for (iVar11 = 0; iVar11 + 7 < iVar10; iVar11 = iVar11 + 8) {
      auVar28 = vminps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar9);
      auVar26._8_4_ = 0x42b0c0a5;
      auVar26._0_8_ = 0x42b0c0a542b0c0a5;
      auVar26._12_4_ = 0x42b0c0a5;
      auVar26._16_4_ = 0x42b0c0a5;
      auVar26._20_4_ = 0x42b0c0a5;
      auVar26._24_4_ = 0x42b0c0a5;
      auVar26._28_4_ = 0x42b0c0a5;
      auVar28 = vminps_avx(auVar28,auVar26);
      auVar27._8_4_ = 0xc2b0c0a5;
      auVar27._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar27._12_4_ = 0xc2b0c0a5;
      auVar27._16_4_ = 0xc2b0c0a5;
      auVar27._20_4_ = 0xc2b0c0a5;
      auVar27._24_4_ = 0xc2b0c0a5;
      auVar27._28_4_ = 0xc2b0c0a5;
      auVar26 = vmaxps_avx(auVar28,auVar27);
      auVar28._0_4_ = auVar26._0_4_ * 1.442695 + 0.5;
      auVar28._4_4_ = auVar26._4_4_ * 1.442695 + 0.5;
      auVar28._8_4_ = auVar26._8_4_ * 1.442695 + 0.5;
      auVar28._12_4_ = auVar26._12_4_ * 1.442695 + 0.5;
      auVar28._16_4_ = auVar26._16_4_ * 1.442695 + 0.5;
      auVar28._20_4_ = auVar26._20_4_ * 1.442695 + 0.5;
      auVar28._24_4_ = auVar26._24_4_ * 1.442695 + 0.5;
      auVar28._28_4_ = 0x3ff8aa3b;
      auVar6 = vroundps_avx(auVar28,1);
      auVar28 = vcmpps_avx(auVar28,auVar6,1);
      auVar28 = vandps_avx(auVar34._0_32_,auVar28);
      auVar28 = vsubps_avx(auVar6,auVar28);
      fVar15 = auVar26._0_4_ + auVar28._0_4_ * -0.6931472;
      fVar16 = auVar26._4_4_ + auVar28._4_4_ * -0.6931472;
      fVar17 = auVar26._8_4_ + auVar28._8_4_ * -0.6931472;
      fVar18 = auVar26._12_4_ + auVar28._12_4_ * -0.6931472;
      fVar19 = auVar26._16_4_ + auVar28._16_4_ * -0.6931472;
      fVar20 = auVar26._20_4_ + auVar28._20_4_ * -0.6931472;
      fVar21 = auVar26._24_4_ + auVar28._24_4_ * -0.6931472;
      auVar22._0_4_ = (int)auVar28._0_4_;
      auVar22._4_4_ = (int)auVar28._4_4_;
      auVar22._8_4_ = (int)auVar28._8_4_;
      auVar22._12_4_ = (int)auVar28._12_4_;
      auVar29._16_4_ = (int)auVar28._16_4_;
      auVar29._0_16_ = auVar22;
      auVar29._20_4_ = (int)auVar28._20_4_;
      auVar29._24_4_ = (int)auVar28._24_4_;
      auVar29._28_4_ = (int)auVar28._28_4_;
      auVar30 = vpslld_avx(auVar22,0x17);
      auVar22 = vpslld_avx(auVar29._16_16_,0x17);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar22 = vpaddd_avx(auVar22,auVar32);
      auVar30 = vpaddd_avx(auVar30,auVar32);
      auVar28 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar9);
      auVar6._4_4_ = (((auVar34._4_4_ + fVar16 +
                       fVar16 * fVar16 *
                       (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16
                         + 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar30._4_4_ +
                      -1.0) * fVar1 + auVar28._4_4_) * fVar2;
      auVar6._0_4_ = (((auVar34._0_4_ + fVar15 +
                       fVar15 * fVar15 *
                       (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15
                         + 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar30._0_4_ +
                      -1.0) * fVar1 + auVar28._0_4_) * fVar2;
      auVar6._8_4_ = (((auVar34._8_4_ + fVar17 +
                       fVar17 * fVar17 *
                       (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17
                         + 0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar30._8_4_ +
                      -1.0) * fVar1 + auVar28._8_4_) * fVar2;
      auVar6._12_4_ =
           (((auVar34._12_4_ + fVar18 +
             fVar18 * fVar18 *
             (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
               0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar30._12_4_ + -1.0) * fVar1
           + auVar28._12_4_) * fVar2;
      auVar6._16_4_ =
           (((auVar34._16_4_ + fVar19 +
             fVar19 * fVar19 *
             (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
               0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar22._0_4_ + -1.0) * fVar1
           + auVar28._16_4_) * fVar2;
      auVar6._20_4_ =
           (((auVar34._20_4_ + fVar20 +
             fVar20 * fVar20 *
             (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
               0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar22._4_4_ + -1.0) * fVar1
           + auVar28._20_4_) * fVar2;
      auVar6._24_4_ =
           (((auVar34._24_4_ + fVar21 +
             fVar21 * fVar21 *
             (((((fVar21 * 0.00019875691 + 0.0013981999) * fVar21 + 0.008333452) * fVar21 +
               0.041665796) * fVar21 + 0.16666666) * fVar21 + 0.5)) * auVar22._8_4_ + -1.0) * fVar1
           + auVar28._24_4_) * fVar2;
      auVar6._28_4_ =
           auVar34._28_4_ + auVar26._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar28._28_4_;
      *pauVar9 = auVar6;
      pauVar9 = pauVar9 + 1;
      lVar13 = lVar13 + 8;
    }
    fVar1 = (this->super_SELU).alpha;
    fVar2 = (this->super_SELU).lambda;
    for (; iVar11 + 3 < iVar10; iVar11 = iVar11 + 4) {
      auVar22 = vminps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar30._8_4_ = 0x42b0c0a5;
      auVar30._0_8_ = 0x42b0c0a542b0c0a5;
      auVar30._12_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(auVar22,auVar30);
      auVar23._8_4_ = 0xc2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._12_4_ = 0xc2b0c0a5;
      auVar32 = vmaxps_avx(auVar22,auVar23);
      auVar24._0_4_ = auVar32._0_4_ * 1.442695 + 0.5;
      auVar24._4_4_ = auVar32._4_4_ * 1.442695 + 0.5;
      auVar24._8_4_ = auVar32._8_4_ * 1.442695 + 0.5;
      auVar24._12_4_ = auVar32._12_4_ * 1.442695 + 0.5;
      auVar31._0_4_ = (int)auVar24._0_4_;
      auVar31._4_4_ = (int)auVar24._4_4_;
      auVar31._8_4_ = (int)auVar24._8_4_;
      auVar31._12_4_ = (int)auVar24._12_4_;
      auVar30 = vcvtdq2ps_avx(auVar31);
      auVar22 = vcmpps_avx(auVar24,auVar30,1);
      auVar33._8_4_ = 0x3f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      auVar33._12_4_ = 0x3f800000;
      auVar22 = vandps_avx(auVar22,auVar33);
      auVar22 = vsubps_avx(auVar30,auVar22);
      fVar15 = auVar32._0_4_ + auVar22._0_4_ * -0.6931472;
      fVar16 = auVar32._4_4_ + auVar22._4_4_ * -0.6931472;
      fVar17 = auVar32._8_4_ + auVar22._8_4_ * -0.6931472;
      fVar18 = auVar32._12_4_ + auVar22._12_4_ * -0.6931472;
      auVar25._0_4_ = (int)auVar22._0_4_;
      auVar25._4_4_ = (int)auVar22._4_4_;
      auVar25._8_4_ = (int)auVar22._8_4_;
      auVar25._12_4_ = (int)auVar22._12_4_;
      auVar22 = vpslld_avx(auVar25,0x17);
      auVar30 = vpaddd_avx(auVar22,auVar33);
      auVar22 = vmaxps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])*pauVar9);
      auVar14._0_4_ =
           (((fVar15 + 1.0 +
             fVar15 * fVar15 *
             (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
               0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar30._0_4_ + -1.0) * fVar1
           + auVar22._0_4_) * fVar2;
      auVar14._4_4_ =
           (((fVar16 + 1.0 +
             fVar16 * fVar16 *
             (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
               0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar30._4_4_ + -1.0) * fVar1
           + auVar22._4_4_) * fVar2;
      auVar14._8_4_ =
           (((fVar17 + 1.0 +
             fVar17 * fVar17 *
             (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
               0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar30._8_4_ + -1.0) * fVar1
           + auVar22._8_4_) * fVar2;
      auVar14._12_4_ =
           (((fVar18 + 1.0 +
             fVar18 * fVar18 *
             (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
               0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar30._12_4_ + -1.0) * fVar1
           + auVar22._12_4_) * fVar2;
      *(undefined1 (*) [16])*pauVar9 = auVar14;
      pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
      lVar13 = lVar13 + 4;
    }
    fVar1 = (this->super_SELU).lambda;
    fVar2 = (this->super_SELU).alpha;
    lVar8 = sVar5 * sVar4 * uVar12;
    for (; (int)lVar13 < iVar10; lVar13 = lVar13 + 1) {
      fVar15 = *(float *)((long)pvVar3 + lVar13 * 4 + lVar8);
      if (0.0 <= fVar15) {
        fVar15 = fVar15 * (this->super_SELU).lambda;
      }
      else {
        fVar15 = expf(fVar15);
        auVar34 = ZEXT3264(CONCAT428(0x3f800000,
                                     CONCAT424(0x3f800000,
                                               CONCAT420(0x3f800000,
                                                         CONCAT416(0x3f800000,
                                                                   CONCAT412(0x3f800000,
                                                                             CONCAT48(0x3f800000,
                                                                                                                                                                            
                                                  0x3f8000003f800000)))))));
        fVar15 = (fVar15 + -1.0) * fVar1 * fVar2;
      }
      *(float *)((long)pvVar3 + lVar13 * 4 + lVar8) = fVar15;
    }
  }
  return 0;
}

Assistant:

int SELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero512 = _mm512_setzero_ps();
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        __m512 _lambda512 = _mm512_set1_ps(lambda);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);

            __m512 _pos = _mm512_max_ps(_zero512, _p);
            __m512 _neg = _mm512_min_ps(_zero512, _p);

            __m512 _blob = exp512_ps(_neg);
            _blob = _mm512_sub_ps(_blob, _one512);
            _blob = _mm512_mul_ps(_alpha512, _blob);
            _blob = _mm512_mul_ps(_lambda512, _mm512_add_ps(_pos, _blob));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero256 = _mm256_setzero_ps();
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        __m256 _lambda256 = _mm256_set1_ps(lambda);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);

            __m256 _pos = _mm256_max_ps(_zero256, _p);
            __m256 _neg = _mm256_min_ps(_zero256, _p);

            __m256 _blob = exp256_ps(_neg);
            _blob = _mm256_sub_ps(_blob, _one256);
            _blob = _mm256_mul_ps(_alpha256, _blob);
            _blob = _mm256_mul_ps(_lambda256, _mm256_add_ps(_pos, _blob));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero128 = _mm_setzero_ps();
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _alpha128 = _mm_set1_ps(alpha);
        __m128 _lambda128 = _mm_set1_ps(lambda);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);

            __m128 _pos = _mm_max_ps(_zero128, _p);
            __m128 _neg = _mm_min_ps(_zero128, _p);

            __m128 _blob = exp_ps(_neg);
            _blob = _mm_sub_ps(_blob, _one128);
            _blob = _mm_mul_ps(_alpha128, _blob);
            _blob = _mm_mul_ps(_lambda128, _mm_add_ps(_pos, _blob));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        float alphaxlambda = alpha * lambda;
        for (; i < size; i++)
        {
            // y = lambda * ( max(0, x) + min(0, alpha * (exp(x) - 1)) )
            if (*ptr < 0)
                *ptr = (expf(*ptr) - 1.f) * alphaxlambda;
            else
                *ptr = *ptr * lambda;
            ptr++;
        }
    }

    return 0;
}